

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

bool __thiscall
spirv_cross::Compiler::execution_is_noop(Compiler *this,SPIRBlock *from,SPIRBlock *to)

{
  size_t sVar1;
  IVariant *pIVar2;
  bool bVar3;
  long lVar4;
  
  bVar3 = execution_is_branchless(this,from,to);
  if (bVar3) {
    bVar3 = true;
    if ((from->super_IVariant).self.id != (to->super_IVariant).self.id) {
      pIVar2 = &from->super_IVariant;
      do {
        bVar3 = (from->ops).super_VectorView<spirv_cross::Instruction>.buffer_size == 0;
        if (!bVar3) goto LAB_00317dc9;
        from = Variant::get<spirv_cross::SPIRBlock>
                         ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                          (from->next_block).id);
        sVar1 = (from->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.buffer_size;
        if (sVar1 != 0) {
          lVar4 = 0;
          do {
            if (*(uint32_t *)
                 ((long)&(((from->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.ptr)
                         ->parent).id + lVar4) == (pIVar2->self).id) goto LAB_00317dc9;
            lVar4 = lVar4 + 0xc;
          } while (sVar1 * 0xc != lVar4);
        }
        pIVar2 = &from->super_IVariant;
      } while ((from->super_IVariant).self.id != (to->super_IVariant).self.id);
    }
  }
  else {
LAB_00317dc9:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Compiler::execution_is_noop(const SPIRBlock &from, const SPIRBlock &to) const
{
	if (!execution_is_branchless(from, to))
		return false;

	auto *start = &from;
	for (;;)
	{
		if (start->self == to.self)
			return true;

		if (!start->ops.empty())
			return false;

		auto &next = get<SPIRBlock>(start->next_block);
		// Flushing phi variables does not count as noop.
		for (auto &phi : next.phi_variables)
			if (phi.parent == start->self)
				return false;

		start = &next;
	}
}